

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

CFinfo * amrex::FabArrayBase::TheCFinfo
                   (FabArrayBase *finefa,Geometry *finegm,IntVect *ng,bool include_periodic,
                   bool include_physbndry)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  _Var4;
  CFinfo *unaff_R13;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  pVar9;
  _Alloc_node __an;
  key_type local_78;
  _Alloc_node local_60;
  undefined1 local_58 [16];
  CFinfo *local_48;
  
  local_78.m_ba_id.data =
       (finefa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.m_dm_id.data =
       (finefa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVar9 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
                         *)m_TheCrseFineCache,&local_78);
  __position._M_node = (_Base_ptr)pVar9.second._M_node;
  p_Var3 = (_Base_ptr)(ulong)include_physbndry;
  bVar5 = pVar9.first._M_node._M_node == __position._M_node;
  if (!bVar5) {
    _Var4._M_node = pVar9.first._M_node._M_node;
    do {
      unaff_R13 = (CFinfo *)_Var4._M_node[1]._M_left;
      auVar6._0_4_ = -(uint)(*(int *)&(unaff_R13->m_fine_bdk).m_ba_id.data ==
                            (int)local_78.m_ba_id.data);
      auVar6._4_4_ = -(uint)(*(int *)((long)&(unaff_R13->m_fine_bdk).m_ba_id.data + 4) ==
                            local_78.m_ba_id.data._4_4_);
      auVar6._8_4_ = -(uint)(*(int *)&(unaff_R13->m_fine_bdk).m_dm_id.data ==
                            (int)local_78.m_dm_id.data);
      auVar6._12_4_ =
           -(uint)(*(int *)((long)&(unaff_R13->m_fine_bdk).m_dm_id.data + 4) ==
                  local_78.m_dm_id.data._4_4_);
      auVar7._4_4_ = auVar6._0_4_;
      auVar7._0_4_ = auVar6._4_4_;
      auVar7._8_4_ = auVar6._12_4_;
      auVar7._12_4_ = auVar6._8_4_;
      iVar2 = movmskpd((int)p_Var3,auVar7 & auVar6);
      if (iVar2 == 3) {
        unaff_R13 = (CFinfo *)&unaff_R13->m_fine_domain;
        CFinfo::Domain((Box *)local_58,finegm,ng,include_periodic,include_physbndry);
        bVar1 = Box::operator==((Box *)unaff_R13,(Box *)local_58);
        if ((((bVar1) &&
             (unaff_R13 = (CFinfo *)_Var4._M_node[1]._M_left,
             (unaff_R13->m_ng).vect[0] == ng->vect[0])) &&
            ((unaff_R13->m_ng).vect[1] == ng->vect[1])) &&
           ((unaff_R13->m_ng).vect[2] == ng->vect[2])) {
          unaff_R13->m_nuse = unaff_R13->m_nuse + 1;
          _DAT_00756fc0 = _DAT_00756fc0 + 1;
          break;
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
      bVar5 = p_Var3 == __position._M_node;
      _Var4._M_node = p_Var3;
    } while (!bVar5);
  }
  if (bVar5) {
    unaff_R13 = (CFinfo *)operator_new(0xd8);
    CFinfo::CFinfo(unaff_R13,finefa,finegm,ng,include_periodic,include_physbndry);
    iVar2 = m_CFinfo_stats + 1;
    if (m_CFinfo_stats < DAT_00756fb4) {
      iVar2 = DAT_00756fb4;
    }
    m_CFinfo_stats = m_CFinfo_stats + 1;
    unaff_R13->m_nuse = 1;
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    _DAT_00756fc0 = _DAT_00756fc0 + 1;
    lRam0000000000756fc8 = lRam0000000000756fc8 - auVar8._8_8_;
    local_58._0_8_ = local_78.m_ba_id.data;
    local_58._8_8_ = local_78.m_dm_id.data;
    local_60._M_t =
         (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
          *)m_TheCrseFineCache;
    DAT_00756fb4 = iVar2;
    local_48 = unaff_R13;
    std::
    _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
    ::
    _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>::_Alloc_node>
              ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
                *)m_TheCrseFineCache,__position,
               (pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*> *)local_58,
               &local_60);
  }
  return unaff_R13;
}

Assistant:

const FabArrayBase::CFinfo&
FabArrayBase::TheCFinfo (const FabArrayBase& finefa,
                         const Geometry&     finegm,
                         const IntVect&      ng,
                         bool                include_periodic,
                         bool                include_physbndry)
{
    BL_PROFILE("FabArrayBase::TheCFinfo()");

    const BDKey& key = finefa.getBDKey();
    auto er_it = m_TheCrseFineCache.equal_range(key);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_fine_bdk    == key                        &&
            it->second->m_fine_domain == CFinfo::Domain(finegm, ng,
                                                        include_periodic,
                                                        include_physbndry) &&
            it->second->m_ng          == ng)
        {
            ++(it->second->m_nuse);
            m_CFinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    CFinfo* new_cfinfo = new CFinfo(finefa, finegm, ng, include_periodic, include_physbndry);

#ifdef AMREX_MEM_PROFILING
    m_CFinfo_stats.bytes += new_cfinfo->bytes();
    m_CFinfo_stats.bytes_hwm = std::max(m_CFinfo_stats.bytes_hwm, m_CFinfo_stats.bytes);
#endif

    new_cfinfo->m_nuse = 1;
    m_CFinfo_stats.recordBuild();
    m_CFinfo_stats.recordUse();

    m_TheCrseFineCache.insert(er_it.second, CFinfoCache::value_type(key,new_cfinfo));

    return *new_cfinfo;
}